

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timer7_memfunc.cpp
# Opt level: O0

int main(void)

{
  undefined1 local_98 [8];
  Printer printer;
  io_context io_context;
  
  boost::asio::io_context::io_context((io_context *)&printer.count_);
  Printer::Printer((Printer *)local_98,(io_context *)&printer.count_);
  boost::asio::io_context::run((io_context *)&printer.count_);
  Printer::~Printer((Printer *)local_98);
  boost::asio::io_context::~io_context((io_context *)&printer.count_);
  return 0;
}

Assistant:

int main() {
  boost::asio::io_context io_context;

  Printer printer{ io_context };

  io_context.run();

  return 0;
}